

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::UpdateHoveredWindowAndCaptureFlags(void)

{
  ImVector<ImGuiWindow_*> *this;
  double *pdVar1;
  double dVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  ImVec2 IVar5;
  ImVec2 IVar6;
  ImGuiContext *pIVar7;
  bool bVar8;
  uint uVar9;
  ImGuiWindow **ppIVar10;
  ImGuiWindow *potential_parent;
  byte bVar11;
  bool bVar12;
  byte bVar13;
  int iVar14;
  ulong uVar15;
  byte bVar16;
  ulong uVar17;
  ImGuiWindow *pIVar18;
  ImGuiWindow *pIVar19;
  int iVar20;
  float fVar21;
  float fVar25;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  ImRect local_78;
  ImVec2 *local_60;
  ImVec2 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  
  pIVar7 = GImGui;
  pIVar19 = GImGui->MovingWindow;
  pIVar18 = (ImGuiWindow *)0x0;
  if ((pIVar19 != (ImGuiWindow *)0x0) && ((pIVar19->Flags & 0x200) == 0)) {
    pIVar18 = pIVar19;
  }
  local_58 = (GImGui->Style).TouchExtraPadding;
  local_48._8_8_ = 0;
  local_48._0_4_ = local_58.x;
  local_48._4_4_ = local_58.y;
  if ((GImGui->IO).ConfigWindowsResizeFromEdges == true) {
    auVar22 = maxps(local_48,_DAT_0056e3d0);
    local_58 = auVar22._0_8_;
  }
  uStack_50 = 0;
  this = &GImGui->Windows;
  local_60 = &(GImGui->IO).MousePos;
  iVar14 = (GImGui->Windows).Size;
  do {
    do {
      iVar20 = iVar14;
      if (iVar20 < 1) {
        pIVar7->HoveredWindow = pIVar18;
        if (pIVar18 == (ImGuiWindow *)0x0) {
          pIVar18 = (ImGuiWindow *)0x0;
          pIVar19 = (ImGuiWindow *)0x0;
        }
        else {
LAB_002cc87b:
          pIVar19 = pIVar18->RootWindow;
        }
        pIVar7->HoveredRootWindow = pIVar19;
        potential_parent = GetTopMostPopupModal();
        if (((potential_parent != (ImGuiWindow *)0x0) && (pIVar19 != (ImGuiWindow *)0x0)) &&
           (bVar8 = IsWindowChildOf(pIVar19,potential_parent), !bVar8)) {
          pIVar7->HoveredWindow = (ImGuiWindow *)0x0;
          pIVar7->HoveredRootWindow = (ImGuiWindow *)0x0;
          pIVar18 = (ImGuiWindow *)0x0;
        }
        uVar9 = (pIVar7->IO).ConfigFlags;
        if ((uVar9 & 0x10) != 0) {
          pIVar7->HoveredWindow = (ImGuiWindow *)0x0;
          pIVar7->HoveredRootWindow = (ImGuiWindow *)0x0;
          pIVar18 = (ImGuiWindow *)0x0;
        }
        uVar15 = 0xffffffffffffffff;
        uVar17 = 0;
        bVar11 = 0;
        while( true ) {
          iVar14 = (int)uVar15;
          if (uVar17 == 5) break;
          if ((pIVar7->IO).MouseClicked[uVar17] == true) {
            bVar8 = true;
            if (pIVar18 == (ImGuiWindow *)0x0) {
              bVar8 = (pIVar7->OpenPopupStack).Size != 0;
            }
            (pIVar7->IO).MouseDownOwned[uVar17] = bVar8;
          }
          bVar8 = (pIVar7->IO).MouseDown[uVar17];
          if ((bVar8 == true) &&
             ((iVar14 == -1 ||
              (dVar2 = (pIVar7->IO).MouseClickedTime[iVar14],
              pdVar1 = (pIVar7->IO).MouseClickedTime + uVar17, *pdVar1 <= dVar2 && dVar2 != *pdVar1)
              ))) {
            uVar15 = uVar17 & 0xffffffff;
          }
          bVar11 = bVar11 & 1 | bVar8;
          uVar17 = uVar17 + 1;
        }
        if (iVar14 == -1) {
          bVar13 = 1;
        }
        else {
          bVar13 = (pIVar7->IO).MouseDownOwned[iVar14];
        }
        if (pIVar7->DragDropActive == true) {
          bVar16 = ((byte)pIVar7->DragDropSourceFlags & 0x10) >> 4;
        }
        else {
          bVar16 = 0;
        }
        if (bVar16 == 0 && (bVar13 & 1) == 0) {
          pIVar7->HoveredWindow = (ImGuiWindow *)0x0;
          pIVar7->HoveredRootWindow = (ImGuiWindow *)0x0;
          pIVar18 = (ImGuiWindow *)0x0;
        }
        if (pIVar7->WantCaptureMouseNextFrame == -1) {
          bVar8 = true;
          if ((bVar13 & (pIVar18 != (ImGuiWindow *)0x0 | bVar11)) == 0) {
            bVar8 = (pIVar7->OpenPopupStack).Size != 0;
          }
          (pIVar7->IO).WantCaptureMouse = bVar8;
        }
        else {
          (pIVar7->IO).WantCaptureMouse = pIVar7->WantCaptureMouseNextFrame != 0;
        }
        if (pIVar7->WantCaptureKeyboardNextFrame == -1) {
          bVar8 = pIVar7->ActiveId != 0 || potential_parent != (ImGuiWindow *)0x0;
        }
        else {
          bVar8 = pIVar7->WantCaptureKeyboardNextFrame != 0;
        }
        bVar12 = true;
        if ((pIVar7->IO).NavActive == false) {
          bVar12 = bVar8;
        }
        if ((uVar9 & 9) != 1) {
          bVar12 = bVar8;
        }
        (pIVar7->IO).WantCaptureKeyboard = bVar12;
        (pIVar7->IO).WantTextInput = pIVar7->WantTextInputNextFrame - 1U < 0xfffffffe;
        return;
      }
      iVar14 = iVar20 + -1;
      ppIVar10 = ImVector<ImGuiWindow_*>::operator[](this,iVar14);
      pIVar19 = *ppIVar10;
    } while (((pIVar19->Active != true) || (pIVar19->Hidden != false)) ||
            ((pIVar19->Flags & 0x200) != 0));
    IVar5 = (pIVar19->OuterRectClipped).Min;
    IVar6 = (pIVar19->OuterRectClipped).Max;
    uVar9 = (uint)((pIVar19->Flags & 0x1000042U) == 0);
    auVar23._0_4_ = (int)(uVar9 << 0x1f) >> 0x1f;
    auVar23._4_4_ = (int)(uVar9 << 0x1f) >> 0x1f;
    auVar23._8_8_ = 0;
    auVar22._8_8_ = uStack_50;
    auVar22._0_4_ = local_58.x;
    auVar22._4_4_ = local_58.y;
    auVar24 = ~auVar23 & local_48 | auVar22 & auVar23;
    fVar21 = auVar24._0_4_;
    fVar25 = auVar24._4_4_;
    auVar3._4_8_ = SUB168(auVar22 & auVar23,8);
    auVar3._0_4_ = fVar25;
    auVar24._0_8_ = auVar3._0_8_ << 0x20;
    auVar24._8_4_ = fVar21;
    auVar24._12_4_ = fVar25;
    local_78.Min.x = IVar5.x;
    local_78.Min.y = IVar5.y;
    local_78.Max.x = IVar6.x;
    local_78.Max.y = IVar6.y;
    auVar4._4_8_ = auVar24._8_8_;
    auVar4._0_4_ = fVar25 + local_78.Min.y;
    auVar26._0_8_ = auVar4._0_8_ << 0x20;
    auVar26._8_4_ = fVar21 + local_78.Max.x;
    auVar26._12_4_ = fVar25 + local_78.Max.y;
    local_78.Max = auVar26._8_8_;
    local_78.Min.y = local_78.Min.y - fVar25;
    local_78.Min.x = local_78.Min.x - fVar21;
    bVar8 = ImRect::Contains(&local_78,local_60);
    if (bVar8) {
      if (pIVar18 == (ImGuiWindow *)0x0) {
        pIVar18 = pIVar19;
      }
      if (pIVar18 != (ImGuiWindow *)0x0) {
        pIVar7->HoveredWindow = pIVar18;
        goto LAB_002cc87b;
      }
      pIVar18 = (ImGuiWindow *)0x0;
    }
    iVar14 = iVar20 + -1;
  } while( true );
}

Assistant:

void ImGui::UpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    FindHoveredWindow();

    // Modal windows prevents cursor from hovering behind them.
    ImGuiWindow* modal_window = GetTopMostPopupModal();
    if (modal_window)
        if (g.HoveredRootWindow && !IsWindowChildOf(g.HoveredRootWindow, modal_window))
            g.HoveredRootWindow = g.HoveredWindow = NULL;

    // Disabled mouse?
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NoMouse)
        g.HoveredWindow = g.HoveredRootWindow = NULL;

    // We track click ownership. When clicked outside of a window the click is owned by the application and won't report hovering nor request capture even while dragging over our windows afterward.
    int mouse_earliest_button_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        if (g.IO.MouseClicked[i])
            g.IO.MouseDownOwned[i] = (g.HoveredWindow != NULL) || (!g.OpenPopupStack.empty());
        mouse_any_down |= g.IO.MouseDown[i];
        if (g.IO.MouseDown[i])
            if (mouse_earliest_button_down == -1 || g.IO.MouseClickedTime[i] < g.IO.MouseClickedTime[mouse_earliest_button_down])
                mouse_earliest_button_down = i;
    }
    const bool mouse_avail_to_imgui = (mouse_earliest_button_down == -1) || g.IO.MouseDownOwned[mouse_earliest_button_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail_to_imgui && !mouse_dragging_extern_payload)
        g.HoveredWindow = g.HoveredRootWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to imgui, false = dispatch mouse info to Dear ImGui + app)
    if (g.WantCaptureMouseNextFrame != -1)
        g.IO.WantCaptureMouse = (g.WantCaptureMouseNextFrame != 0);
    else
        g.IO.WantCaptureMouse = (mouse_avail_to_imgui && (g.HoveredWindow != NULL || mouse_any_down)) || (!g.OpenPopupStack.empty());

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to imgui, false = dispatch keyboard info to Dear ImGui + app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        g.IO.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        g.IO.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (g.IO.NavActive && (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        g.IO.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    g.IO.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}